

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_number_t::Generate(ast_number_t *this,ostream *output,int pc)

{
  ostream *this_00;
  void *this_01;
  int pc_local;
  ostream *output_local;
  ast_number_t *this_local;
  
  this_00 = std::operator<<(output,"push ");
  this_01 = (void *)std::ostream::operator<<(this_00,this->value);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return pc + 1;
}

Assistant:

int ast_number_t::Generate(std::ostream& output, int pc) const {
    output << "push " << this->value << std::endl;
    return pc + 1;
  }